

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

char * GetBytecodeFromPath(ParseContext *ctx,Lexeme *start,IntrusiveList<SynIdentifier> parts)

{
  CompilerStatistics *this;
  Allocator *pAVar1;
  ArrayView<InplaceStr> AVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  InplaceStr *this_00;
  size_t sVar7;
  undefined4 extraout_var;
  uint i;
  char *pcVar8;
  char *pcVar9;
  InplaceStr local_d0;
  Lexeme *local_c0;
  char *pos;
  InplaceStr *local_b0;
  uint uStack_a8;
  undefined4 uStack_a4;
  TraceScope traceScope;
  GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> allocator;
  ChunkedStackPool<65532> pool;
  ErrorInfo *local_38;
  
  local_c0 = start;
  uVar4 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar4;
  (ctx->statistics).finishTime = 0;
  local_d0 = GetModuleName(ctx->allocator,ctx->moduleRoot,parts);
  if (GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)::token == '\0') {
    iVar5 = __cxa_guard_acquire(&GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)
                                 ::token);
    if (iVar5 != 0) {
      GetBytecodeFromPath::token = NULLC::TraceGetToken("parser","GetBytecodeFromPath");
      __cxa_guard_release(&GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)::
                           token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,GetBytecodeFromPath::token);
  NULLC::TraceLabel(local_d0.begin,local_d0.end);
  pcVar6 = BinaryCache::FindBytecode(local_d0.begin,false);
  if (pcVar6 == (char *)0x0) {
    local_d0 = GetModuleName(ctx->allocator,(char *)0x0,parts);
    pcVar6 = BinaryCache::FindBytecode(local_d0.begin,false);
  }
  this = &ctx->statistics;
  uVar4 = 0;
  do {
    if ((ctx->activeImports).count <= uVar4) {
      SmallArray<InplaceStr,_8U>::push_back(&ctx->activeImports,&local_d0);
      if (pcVar6 == (char *)0x0) {
        if (ctx->bytecodeBuilder ==
            (_func_char_ptr_Allocator_ptr_InplaceStr_char_ptr_bool_char_ptr_ptr_char_ptr_uint_int_ArrayView<InplaceStr>_CompilerStatistics_ptr
             *)0x0) {
          anon_unknown.dwarf_153727::Stop(ctx,local_c0,"ERROR: import builder is not provided");
        }
        if (ctx->errorCount == 0) {
          ctx->errorPos = local_c0->pos;
          pcVar8 = ctx->errorBuf;
          ctx->errorBufLocation = pcVar8;
        }
        else {
          pcVar8 = ctx->errorBufLocation;
        }
        allocator.pool = &pool;
        pool.first = (StackChunk *)0x0;
        pool.curr = (StackChunk *)0x0;
        pool.size = 0xfffc;
        allocator.super_Allocator._vptr_Allocator = (_func_int **)&PTR__GrowingAllocatorRef_003e4588
        ;
        allocator.total = 0;
        allocator.allocLimit = 0xffffffff;
        allocator.allocLimitContext = (void *)0x0;
        allocator.allocLimitCallback = (_func_void_void_ptr *)0x0;
        allocator.largeObjects.data = (void **)0x0;
        allocator.largeObjects.max = 0;
        allocator.largeObjects.count = 0;
        uVar4 = NULLCTime::clockMicro();
        CompilerStatistics::Finish(this,"Extra",uVar4);
        pos = (char *)0x0;
        local_b0 = (ctx->activeImports).data;
        uStack_a8 = (ctx->activeImports).count;
        AVar2._12_4_ = uStack_a4;
        AVar2.count = uStack_a8;
        AVar2.data = local_b0;
        pcVar6 = (*ctx->bytecodeBuilder)
                           (&allocator.super_Allocator,local_d0,ctx->moduleRoot,false,&pos,
                            ctx->errorBufLocation,
                            (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                            ctx->errorBufSize,ctx->optimizationLevel,AVar2,this);
        uVar4 = NULLCTime::clockMicro();
        (ctx->statistics).startTime = uVar4;
        (ctx->statistics).finishTime = 0;
        if (pcVar6 == (char *)0x0) {
          if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
            pcVar9 = ctx->errorBufLocation;
            sVar7 = strlen(pcVar9);
            pcVar9 = pcVar9 + sVar7;
            ctx->errorBufLocation = pcVar9;
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
            local_38 = (ErrorInfo *)CONCAT44(extraout_var,iVar5);
            pAVar1 = ctx->allocator;
            local_38->messageStart = pcVar8;
            local_38->messageEnd = pcVar9;
            local_38->begin = local_c0;
            local_38->end = local_c0;
            local_38->pos = pos;
            (local_38->related).allocator = pAVar1;
            (local_38->related).data = (local_38->related).little;
            (local_38->related).count = 0;
            (local_38->related).max = 4;
            local_38->parentModule = (ModuleData *)0x0;
            SmallArray<ErrorInfo_*,_4U>::push_back(&ctx->errorInfo,&local_38);
            AddErrorLocationInfo
                      (ctx->code,pos,ctx->errorBufLocation,
                       (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize);
            pcVar8 = ctx->errorBufLocation;
            sVar7 = strlen(pcVar8);
            ctx->errorBufLocation = pcVar8 + sVar7;
          }
          ctx->errorCount = ctx->errorCount + 1;
        }
        GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::~GrowingAllocatorRef(&allocator);
        ChunkedStackPool<65532>::~ChunkedStackPool(&pool);
      }
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(this,"Extra",uVar4);
      NULLC::TraceScope::~TraceScope(&traceScope);
      return pcVar6;
    }
    this_00 = SmallArray<InplaceStr,_8U>::operator[](&ctx->activeImports,uVar4);
    bVar3 = InplaceStr::operator==(this_00,&local_d0);
    uVar4 = uVar4 + 1;
  } while (!bVar3);
  anon_unknown.dwarf_153727::Stop
            (ctx,local_c0,"ERROR: found cyclic dependency on module \'%.*s\'",
             (ulong)(uint)((int)local_d0.end - (int)local_d0.begin));
}

Assistant:

const char* GetBytecodeFromPath(ParseContext &ctx, Lexeme *start, IntrusiveList<SynIdentifier> parts)
{
	ctx.statistics.Start(NULLCTime::clockMicro());

	InplaceStr moduleName = GetModuleName(ctx.allocator, ctx.moduleRoot, parts);

	TRACE_SCOPE("parser", "GetBytecodeFromPath");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	const char *bytecode = BinaryCache::FindBytecode(moduleName.begin, false);

	if(!bytecode)
	{
		moduleName = GetModuleName(ctx.allocator, NULL, parts);

		bytecode = BinaryCache::FindBytecode(moduleName.begin, false);
	}

	for(unsigned i = 0; i < ctx.activeImports.size(); i++)
	{
		if(ctx.activeImports[i] == moduleName)
			Stop(ctx, start, "ERROR: found cyclic dependency on module '%.*s'", moduleName.length(), moduleName.begin);
	}

	ctx.activeImports.push_back(moduleName);

	if(!bytecode)
	{
		if(!ctx.bytecodeBuilder)
			Stop(ctx, start, "ERROR: import builder is not provided");

		if(ctx.errorCount == 0)
		{
			ctx.errorPos = start->pos;
			ctx.errorBufLocation = ctx.errorBuf;
		}

		const char *messageStart = ctx.errorBufLocation;

		// Separate allocator for each module
		ChunkedStackPool<65532> pool;
		GrowingAllocatorRef<ChunkedStackPool<65532>, 16384> allocator(pool);

		ctx.statistics.Finish("Extra", NULLCTime::clockMicro());

		const char *pos = NULL;
		bytecode = ctx.bytecodeBuilder(&allocator, moduleName, ctx.moduleRoot, false, &pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), ctx.optimizationLevel, ctx.activeImports, &ctx.statistics);

		ctx.statistics.Start(NULLCTime::clockMicro());

		if(!bytecode)
		{
			if(ctx.errorBuf && ctx.errorBufSize)
			{
				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, start, start, pos));

				AddErrorLocationInfo(ctx.code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			ctx.errorCount++;
		}
	}

	ctx.statistics.Finish("Extra", NULLCTime::clockMicro());

	return bytecode;
}